

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool Json::parseFromStream(Factory *fact,istream *sin,Value *root,string *errs)

{
  int iVar1;
  streambuf *psVar2;
  long lVar3;
  long lVar4;
  undefined4 extraout_var;
  pointer pCVar5;
  unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> local_1e8;
  CharReaderPtr reader;
  char *end;
  char *begin;
  string doc;
  ostringstream local_1a0 [8];
  ostringstream ssin;
  string *errs_local;
  Value *root_local;
  istream *sin_local;
  Factory *fact_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  psVar2 = (streambuf *)std::ios::rdbuf();
  std::ostream::operator<<(local_1a0,psVar2);
  std::__cxx11::ostringstream::str();
  lVar3 = std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::size();
  reader._M_t.super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
  super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl =
       (__uniq_ptr_data<Json::CharReader,_std::default_delete<Json::CharReader>,_true,_true>)
       (lVar3 + lVar4);
  iVar1 = (*fact->_vptr_Factory[2])();
  std::unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>>::
  unique_ptr<std::default_delete<Json::CharReader>,void>
            ((unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>> *)&local_1e8,
             (pointer)CONCAT44(extraout_var,iVar1));
  pCVar5 = std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::operator->
                     (&local_1e8);
  iVar1 = (*pCVar5->_vptr_CharReader[2])
                    (pCVar5,lVar3,
                     reader._M_t.
                     super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>
                     .super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl,root,errs);
  std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::~unique_ptr(&local_1e8)
  ;
  std::__cxx11::string::~string((string *)&begin);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool parseFromStream(
    CharReader::Factory const& fact, JSONCPP_ISTREAM& sin,
    Value* root, JSONCPP_STRING* errs)
{
  JSONCPP_OSTRINGSTREAM ssin;
  ssin << sin.rdbuf();
  JSONCPP_STRING doc = ssin.str();
  char const* begin = doc.data();
  char const* end = begin + doc.size();
  // Note that we do not actually need a null-terminator.
  CharReaderPtr const reader(fact.newCharReader());
  return reader->parse(begin, end, root, errs);
}